

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Optimizer::Optimize
          (Optimizer *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan_p)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  pointer pOVar3;
  type op;
  DBConfig *pDVar4;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  pointer pOVar5;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_38;
  
  local_38._M_head_impl = (LogicalOperator *)this;
  op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(in_RDX);
  ColumnBindingResolver::Verify(op);
  _Var1._M_head_impl =
       (in_RDX->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (in_RDX->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  _Var2._M_head_impl =
       plan_p[0xb].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  plan_p[0xb].
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  pDVar4 = DBConfig::GetConfig((ClientContext *)
                               (plan_p->
                               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               )._M_t.
                               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                              );
  pOVar3 = (pDVar4->optimizer_extensions).
           super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
           super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar5 = (pDVar4->optimizer_extensions).
                super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>
                .
                super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar3; pOVar5 = pOVar5 + 1) {
    local_40 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:276:42)>
               ::_M_invoke;
    local_48 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:276:42)>
               ::_M_manager;
    local_58._M_unused._M_object = plan_p;
    local_58._8_8_ = pOVar5;
    RunOptimizer((Optimizer *)plan_p,EXTENSION,(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  RunBuiltInOptimizers((Optimizer *)plan_p);
  pDVar4 = DBConfig::GetConfig((ClientContext *)
                               (plan_p->
                               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               )._M_t.
                               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                              );
  pOVar3 = (pDVar4->optimizer_extensions).
           super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
           super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar5 = (pDVar4->optimizer_extensions).
                super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>
                .
                super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar3; pOVar5 = pOVar5 + 1) {
    local_40 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:287:42)>
               ::_M_invoke;
    local_48 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/optimizer.cpp:287:42)>
               ::_M_manager;
    local_58._M_unused._M_object = plan_p;
    local_58._8_8_ = pOVar5;
    RunOptimizer((Optimizer *)plan_p,EXTENSION,(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  Planner::VerifyPlan((ClientContext *)
                      (plan_p->
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                      plan_p + 0xb,
                      (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>,_true>
                       )0x0);
  (local_38._M_head_impl)->_vptr_LogicalOperator =
       (_func_int **)
       plan_p[0xb].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  plan_p[0xb].
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  return ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         local_38._M_head_impl).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>;
}

Assistant:

unique_ptr<LogicalOperator> Optimizer::Optimize(unique_ptr<LogicalOperator> plan_p) {
	Verify(*plan_p);

	this->plan = std::move(plan_p);

	for (auto &pre_optimizer_extension : DBConfig::GetConfig(context).optimizer_extensions) {
		RunOptimizer(OptimizerType::EXTENSION, [&]() {
			OptimizerExtensionInput input {GetContext(), *this, pre_optimizer_extension.optimizer_info.get()};
			if (pre_optimizer_extension.pre_optimize_function) {
				pre_optimizer_extension.pre_optimize_function(input, plan);
			}
		});
	}

	RunBuiltInOptimizers();

	for (auto &optimizer_extension : DBConfig::GetConfig(context).optimizer_extensions) {
		RunOptimizer(OptimizerType::EXTENSION, [&]() {
			OptimizerExtensionInput input {GetContext(), *this, optimizer_extension.optimizer_info.get()};
			if (optimizer_extension.optimize_function) {
				optimizer_extension.optimize_function(input, plan);
			}
		});
	}

	Planner::VerifyPlan(context, plan);

	return std::move(plan);
}